

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_stalactites(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  ROOM_AFFECT_DATA RStack_78;
  
  bVar1 = is_outside(ch);
  if (bVar1) {
    txt = "You must be indoors to cast this spell.\n\r";
  }
  else {
    bVar1 = is_affected_room(ch->in_room,(int)gsn_stalactites);
    if (!bVar1) {
      act("You cause razor-sharp stalactites to sprout from the ceiling above.",ch,(void *)0x0,
          (void *)0x0,3);
      act("$n raises one arm and icy stalactites form on the ceiling above.",ch,(void *)0x0,
          (void *)0x0,0);
      init_affect_room(&RStack_78);
      RStack_78.where = 0;
      RStack_78.aftype = 0;
      RStack_78.type = gsn_stalactites;
      RStack_78.location = 0;
      RStack_78.level = (short)level;
      iVar2 = dice(1,6);
      RStack_78.modifier = (short)iVar2;
      RStack_78.duration =
           (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
      RStack_78.tick_fun = (RAFF_FUN *)0x0;
      RStack_78.end_fun = (RAFF_FUN *)0x0;
      RStack_78.owner = ch;
      new_affect_to_room(ch->in_room,&RStack_78);
      return;
    }
    txt = "There are already stalactites hanging here.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_stalactites(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_AFFECT_DATA raf;

	if (is_outside(ch))
	{
		send_to_char("You must be indoors to cast this spell.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_stalactites))
	{
		send_to_char("There are already stalactites hanging here.\n\r", ch);
		return;
	}

	act("You cause razor-sharp stalactites to sprout from the ceiling above.", ch, 0, 0, TO_CHAR);
	act("$n raises one arm and icy stalactites form on the ceiling above.", ch, 0, 0, TO_ROOM);

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.aftype = AFT_SPELL;
	raf.type = gsn_stalactites;
	raf.level = level;
	raf.location = 0;
	raf.modifier = dice(1, 6);
	raf.duration = level / 5;
	raf.owner = ch;
	raf.end_fun = nullptr;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);
}